

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

unsigned_short __thiscall Am_Object::Get_Type_Check(Am_Object *this,Am_Slot_Key key)

{
  Am_Slot_Data *pAVar1;
  
  if (this->data == (Am_Object_Data *)0x0) {
    Am_Error("Get_Type_Check called on a (0L) object.");
  }
  pAVar1 = Am_Object_Data::find_slot(this->data,key);
  if (pAVar1 != (Am_Slot_Data *)0x0) {
    return pAVar1->type_check;
  }
  slot_error("Get_Type_Check: slot does not exist",this,key);
}

Assistant:

unsigned short
Am_Object::Get_Type_Check(Am_Slot_Key key) const
{
  if (!data)
    Am_Error("Get_Type_Check called on a (0L) object.");
  Am_Slot_Data *slot = data->find_slot(key);
  if (!slot)
    slot_error("Get_Type_Check: slot does not exist", *this, key);
  return Am_Slot(slot).Get_Type_Check();
}